

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * anon_unknown.dwarf_20a43d::TryGetMemberAccessPointerAndOffset
                    (ExpressionContext *ctx,VmInstruction *address,VmConstant *offset,
                    VmConstant **totalOffset)

{
  VmValue **ppVVar1;
  VmValue *pVVar2;
  VmConstant *pVVar3;
  SmallArray<VmValue_*,_4U> *this;
  VmValue *pVVar4;
  uint index;
  VmValue *pVVar5;
  
  if (address->cmd == VM_INST_ADD) {
    this = &address->arguments;
    ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](this,0);
    pVVar5 = *ppVVar1;
    if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 1)) {
      pVVar5 = (VmValue *)0x0;
    }
    index = 1;
    ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](this,1);
    pVVar2 = *ppVVar1;
    if ((pVVar2 == (VmValue *)0x0) || (pVVar2->typeID != 1)) {
      pVVar2 = (VmValue *)0x0;
    }
    if ((pVVar5 == (VmValue *)0x0) ||
       (pVVar4 = pVVar5, pVVar5[1].comment.end != (char *)0x0 || pVVar2 != (VmValue *)0x0)) {
      index = 0;
      if (pVVar2 == (VmValue *)0x0) {
        return (VmValue *)0x0;
      }
      pVVar4 = pVVar2;
      if (pVVar5 != (VmValue *)0x0 || pVVar2[1].comment.end != (char *)0x0) {
        return (VmValue *)0x0;
      }
    }
    pVVar3 = CreateConstantInt(ctx->allocator,(SynBase *)0x0,
                               *(int *)&pVVar4[1]._vptr_VmValue + offset->iValue);
    *totalOffset = pVVar3;
    ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](this,index);
    pVVar5 = *ppVVar1;
  }
  else {
    pVVar5 = (VmValue *)0x0;
  }
  return pVVar5;
}

Assistant:

VmValue* TryGetMemberAccessPointerAndOffset(ExpressionContext &ctx, VmInstruction *address, VmConstant *offset, VmConstant **totalOffset)
	{
		if(address->cmd == VM_INST_ADD)
		{
			VmConstant *lhsAsConstant = getType<VmConstant>(address->arguments[0]);
			VmConstant *rhsAsConstant = getType<VmConstant>(address->arguments[1]);

			if(lhsAsConstant && !lhsAsConstant->container && !rhsAsConstant)
			{
				*totalOffset = CreateConstantInt(ctx.allocator, NULL, offset->iValue + lhsAsConstant->iValue);

				return address->arguments[1];
			}
			else if(rhsAsConstant && !rhsAsConstant->container && !lhsAsConstant)
			{
				*totalOffset = CreateConstantInt(ctx.allocator, NULL, offset->iValue + rhsAsConstant->iValue);

				return address->arguments[0];
			}
		}

		return NULL;
	}